

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::ComputeItemParserInfo(cmComputeLinkInformation *this)

{
  cmMakefile *pcVar1;
  string_view sVar2;
  bool bVar3;
  string *psVar4;
  reference e;
  pointer this_00;
  string local_3d0;
  undefined1 local_3b0 [8];
  string reg_shared;
  cmAlphaNum local_370;
  cmAlphaNum local_340;
  undefined1 local_310 [8];
  string reg_static;
  cmAlphaNum local_2c0;
  undefined1 local_290 [8];
  string reg_any;
  string *p;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_248 [8];
  string reg;
  string libext;
  string *i_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  undefined1 local_1d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sharedSuffixVec;
  string local_1b8;
  cmValue local_198;
  cmValue sharedSuffixes;
  string *i;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_160 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkSuffixVec;
  string local_140;
  cmValue local_120;
  cmValue linkSuffixes;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf;
  cmComputeLinkInformation *this_local;
  
  pcVar1 = this->Makefile;
  local_18 = pcVar1;
  mf = (cmMakefile *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_STATIC_LIBRARY_PREFIX",&local_39);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_38);
  AddLinkPrefix(this,psVar4);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CMAKE_SHARED_LIBRARY_PREFIX",&local_71);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_70);
  AddLinkPrefix(this,psVar4);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_99);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_98);
  AddLinkExtension(this,psVar4,LinkShared);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CMAKE_STATIC_LIBRARY_SUFFIX",&local_c1);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_c0);
  AddLinkExtension(this,psVar4,LinkStatic);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CMAKE_SHARED_LIBRARY_SUFFIX",&local_e9);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_e8);
  AddLinkExtension(this,psVar4,LinkShared);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"CMAKE_LINK_LIBRARY_SUFFIX",
             (allocator<char> *)((long)&linkSuffixes.Value + 7));
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_110);
  AddLinkExtension(this,psVar4,LinkUnknown);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkSuffixes.Value + 7));
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"CMAKE_EXTRA_LINK_EXTENSIONS",
             (allocator<char> *)
             ((long)&linkSuffixVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_120 = cmMakefile::GetDefinition(pcVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&linkSuffixVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = cmValue::operator_cast_to_bool(&local_120);
  if (bVar3) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_120);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_160,sVar2,false);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_160);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_160);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar3) {
      sharedSuffixes.Value =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      AddLinkExtension(this,sharedSuffixes.Value,LinkUnknown);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_160);
  }
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES",
             (allocator<char> *)
             ((long)&sharedSuffixVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_198 = cmMakefile::GetDefinition(pcVar1,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sharedSuffixVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = cmValue::operator_cast_to_bool(&local_198);
  if (bVar3) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_198);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1d8,sVar2,false);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d8);
    i_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&i_1), bVar3) {
      e = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2_1);
      AddLinkExtension(this,e,LinkShared);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8);
  }
  CreateExtensionRegex((string *)((long)&reg.field_2 + 8),this,&this->LinkExtensions,LinkUnknown);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"(.*)",(allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::operator+=((string *)local_248,(string *)(reg.field_2._M_local_buf + 8));
  this_00 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
            operator->(&this->OrderLinkerSearchPath);
  cmOrderDirectories::SetLinkExtensionInfo(this_00,&this->LinkExtensions,(string *)local_248);
  std::__cxx11::string::operator=((string *)local_248,"^(");
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->LinkPrefixes);
  p = (string *)
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->LinkPrefixes);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&p), bVar3) {
    reg_any.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::operator+=((string *)local_248,(string *)reg_any.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_248,"|");
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)local_248,")");
  std::__cxx11::string::operator+=((string *)local_248,"([^/:]*)");
  cmAlphaNum::cmAlphaNum(&local_2c0,(string *)local_248);
  cmAlphaNum::cmAlphaNum
            ((cmAlphaNum *)((long)&reg_static.field_2 + 8),(string *)((long)&reg.field_2 + 8));
  cmStrCat<>((string *)local_290,&local_2c0,(cmAlphaNum *)((long)&reg_static.field_2 + 8));
  cmsys::RegularExpression::compile(&this->ExtractAnyLibraryName,(string *)local_290);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->StaticLinkExtensions);
  if (!bVar3) {
    cmAlphaNum::cmAlphaNum(&local_340,(string *)local_248);
    CreateExtensionRegex
              ((string *)((long)&reg_shared.field_2 + 8),this,&this->StaticLinkExtensions,LinkStatic
              );
    cmAlphaNum::cmAlphaNum(&local_370,(string *)((long)&reg_shared.field_2 + 8));
    cmStrCat<>((string *)local_310,&local_340,&local_370);
    std::__cxx11::string::~string((string *)(reg_shared.field_2._M_local_buf + 8));
    cmsys::RegularExpression::compile(&this->ExtractStaticLibraryName,(string *)local_310);
    std::__cxx11::string::~string((string *)local_310);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->SharedLinkExtensions);
  if (!bVar3) {
    std::__cxx11::string::string((string *)local_3b0,(string *)local_248);
    CreateExtensionRegex(&local_3d0,this,&this->SharedLinkExtensions,LinkShared);
    std::__cxx11::string::operator=((string *)&this->SharedRegexString,(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::operator+=((string *)local_3b0,(string *)&this->SharedRegexString);
    cmsys::RegularExpression::compile(&this->ExtractSharedLibraryName,(string *)local_3b0);
    std::__cxx11::string::~string((string *)local_3b0);
  }
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)(reg.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeItemParserInfo()
{
  // Get possible library name prefixes.
  cmMakefile* mf = this->Makefile;
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX"));
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_PREFIX"));

  // Import library names should be matched and treated as shared
  // libraries for the purposes of linking.
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX"),
                         LinkStatic);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX"),
                         LinkUnknown);
  if (cmValue linkSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_LINK_EXTENSIONS")) {
    std::vector<std::string> linkSuffixVec = cmExpandedList(*linkSuffixes);
    for (std::string const& i : linkSuffixVec) {
      this->AddLinkExtension(i, LinkUnknown);
    }
  }
  if (cmValue sharedSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")) {
    std::vector<std::string> sharedSuffixVec = cmExpandedList(*sharedSuffixes);
    for (std::string const& i : sharedSuffixVec) {
      this->AddLinkExtension(i, LinkShared);
    }
  }

  // Compute a regex to match link extensions.
  std::string libext =
    this->CreateExtensionRegex(this->LinkExtensions, LinkUnknown);

  // Create regex to remove any library extension.
  std::string reg("(.*)");
  reg += libext;
  this->OrderLinkerSearchPath->SetLinkExtensionInfo(this->LinkExtensions, reg);

  // Create a regex to match a library name.  Match index 1 will be
  // the prefix if it exists and empty otherwise.  Match index 2 will
  // be the library name.  Match index 3 will be the library
  // extension.
  reg = "^(";
  for (std::string const& p : this->LinkPrefixes) {
    reg += p;
    reg += "|";
  }
  reg += ")";
  reg += "([^/:]*)";

  // Create a regex to match any library name.
  std::string reg_any = cmStrCat(reg, libext);
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "any regex [%s]\n", reg_any.c_str());
#endif
  this->ExtractAnyLibraryName.compile(reg_any);

  // Create a regex to match static library names.
  if (!this->StaticLinkExtensions.empty()) {
    std::string reg_static = cmStrCat(
      reg, this->CreateExtensionRegex(this->StaticLinkExtensions, LinkStatic));
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex [%s]\n", reg_static.c_str());
#endif
    this->ExtractStaticLibraryName.compile(reg_static);
  }

  // Create a regex to match shared library names.
  if (!this->SharedLinkExtensions.empty()) {
    std::string reg_shared = reg;
    this->SharedRegexString =
      this->CreateExtensionRegex(this->SharedLinkExtensions, LinkShared);
    reg_shared += this->SharedRegexString;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex [%s]\n", reg_shared.c_str());
#endif
    this->ExtractSharedLibraryName.compile(reg_shared);
  }
}